

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_nodeproj.cc
# Opt level: O2

RC __thiscall QL_NodeProj::PrintNode(QL_NodeProj *this,int numTabs)

{
  ostream *poVar1;
  int i;
  int iVar2;
  long lVar3;
  
  iVar2 = 0;
  if (0 < numTabs) {
    iVar2 = numTabs;
  }
  while (iVar2 != 0) {
    std::operator<<((ostream *)&std::cout,"\t");
    iVar2 = iVar2 + -1;
  }
  std::operator<<((ostream *)&std::cout,"--PROJ: \n");
  for (lVar3 = 0; lVar3 < (this->super_QL_Node).attrsInRecSize; lVar3 = lVar3 + 1) {
    iVar2 = (this->super_QL_Node).attrsInRec[lVar3];
    poVar1 = std::operator<<((ostream *)&std::cout," ");
    poVar1 = std::operator<<(poVar1,((this->super_QL_Node).qlm)->attrEntries[iVar2].relName);
    poVar1 = std::operator<<(poVar1,".");
    std::operator<<(poVar1,((this->super_QL_Node).qlm)->attrEntries[iVar2].attrName);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  (*this->prevNode->_vptr_QL_Node[5])(this->prevNode,(ulong)(numTabs + 1));
  return 0;
}

Assistant:

RC QL_NodeProj::PrintNode(int numTabs){
  for(int i=0; i < numTabs; i++){
    cout << "\t";
  }
  cout << "--PROJ: \n";
  for(int i = 0; i < attrsInRecSize; i++){
    int index = attrsInRec[i];
    cout << " " << qlm.attrEntries[index].relName << "." << qlm.attrEntries[index].attrName;
  }
  cout << "\n";
  prevNode.PrintNode(numTabs + 1);

  return (0);
}